

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenerate.cpp
# Opt level: O2

void __thiscall
luna::CodeGenerateVisitor::Visit(CodeGenerateVisitor *this,FunctionStatement *func_stmt,void *data)

{
  SyntaxTree *pSVar1;
  int iVar2;
  ExpVarData_conflict exp_var_data;
  FunctionNameData_conflict name_data;
  Guard g;
  _Any_data local_78;
  code *local_68;
  code *local_60;
  _Any_data local_58;
  code *local_48;
  code *local_40;
  Guard local_38;
  
  local_78._M_unused._M_object = (void *)0x0;
  local_78._8_8_ = 0;
  local_60 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp:1012:9)>
             ::_M_invoke;
  local_68 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp:1012:9)>
             ::_M_manager;
  local_58._12_4_ = 0;
  local_58._8_4_ = this->current_function_->register_id_;
  local_40 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp:1012:9)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp:1012:9)>
             ::_M_manager;
  local_58._M_unused._M_object = this;
  Guard::Guard(&local_38,(function<void_()> *)&local_78,(function<void_()> *)&local_58);
  std::_Function_base::~_Function_base((_Function_base *)&local_58);
  std::_Function_base::~_Function_base((_Function_base *)&local_78);
  iVar2 = GenerateRegisterId(this);
  local_78._4_4_ = iVar2 + 1;
  local_78._0_4_ = iVar2;
  pSVar1 = (func_stmt->func_body_)._M_t.
           super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
           super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
           super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
  (*pSVar1->_vptr_SyntaxTree[2])(pSVar1,this);
  local_58._0_4_ = iVar2;
  pSVar1 = (func_stmt->func_name_)._M_t.
           super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
           super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
           super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
  (*pSVar1->_vptr_SyntaxTree[2])(pSVar1,this);
  Guard::~Guard(&local_38);
  return;
}

Assistant:

void CodeGenerateVisitor::Visit(FunctionStatement *func_stmt, void *data)
    {
        REGISTER_GENERATOR_GUARD();
        auto func_register = GenerateRegisterId();
        ExpVarData exp_var_data{ func_register, func_register + 1 };
        func_stmt->func_body_->Accept(this, &exp_var_data);

        FunctionNameData name_data{ func_register };
        func_stmt->func_name_->Accept(this, &name_data);
    }